

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

string * __thiscall
glcts::GetDef2DVtxSrc_abi_cxx11_(string *__return_storage_ptr__,glcts *this,GLSLVersion glslVersion)

{
  char *pcVar1;
  ostream *poVar2;
  stringstream local_1a0 [8];
  stringstream str;
  ostream local_190;
  GLSLVersion local_14;
  string *psStack_10;
  GLSLVersion glslVersion_local;
  
  local_14 = (GLSLVersion)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  pcVar1 = glu::getGLSLVersionDeclaration(local_14);
  poVar2 = std::operator<<(&local_190,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,
                  "in highp vec2 aPos;\nvoid main() {\n   gl_Position = vec4(aPos, 0.0, 1.0);\n}\n")
  ;
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetDef2DVtxSrc(glu::GLSLVersion glslVersion)
{
	std::stringstream str;

	DE_ASSERT(glslVersion == glu::GLSL_VERSION_310_ES || glslVersion >= glu::GLSL_VERSION_430);

	str << glu::getGLSLVersionDeclaration(glslVersion) << "\n"
		<< "in highp vec2 aPos;\n"
		   "void main() {\n"
		   "   gl_Position = vec4(aPos, 0.0, 1.0);\n"
		   "}\n";
	return str.str();
}